

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O0

string * __thiscall CodeGen::generateType_abi_cxx11_(CodeGen *this,NodePtr *n)

{
  bool bVar1;
  Type TVar2;
  type this_00;
  pointer ppVar3;
  mapped_type *this_01;
  shared_ptr<avro::Node> *in_RDX;
  string *in_RDI;
  NodePtr *in_stack_00000040;
  CodeGen *in_stack_00000048;
  const_iterator it;
  NodePtr nn;
  string *result;
  shared_ptr<avro::Node> *in_stack_ffffffffffffff78;
  shared_ptr<avro::Node> *in_stack_ffffffffffffff80;
  iterator local_58;
  _Rb_tree_const_iterator<std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  key_type *in_stack_ffffffffffffffb8;
  map<boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffffc0;
  iterator local_38;
  _Rb_tree_const_iterator<std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30 [3];
  
  this_00 = boost::shared_ptr<avro::Node>::operator->(in_RDX);
  TVar2 = avro::Node::type(this_00);
  if (TVar2 == AVRO_NUM_TYPES) {
    avro::resolveSymbol(in_RDX);
  }
  else {
    boost::shared_ptr<avro::Node>::shared_ptr(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  local_38._M_node =
       (_Base_ptr)
       std::
       map<boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((map<boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)in_stack_ffffffffffffff78,(key_type *)0x1ba33d);
  std::
  _Rb_tree_const_iterator<std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree_const_iterator(local_30,&local_38);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffff78);
  std::
  _Rb_tree_const_iterator<std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree_const_iterator(&local_50,&local_58);
  bVar1 = std::operator!=(local_30,&local_50);
  if (bVar1) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x1ba3a1);
    std::__cxx11::string::string((string *)in_RDI,(string *)&ppVar3->second);
  }
  else {
    doGenerateType_abi_cxx11_(in_stack_00000048,in_stack_00000040);
    this_01 = std::
              map<boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    std::__cxx11::string::operator=((string *)this_01,(string *)in_RDI);
  }
  boost::shared_ptr<avro::Node>::~shared_ptr((shared_ptr<avro::Node> *)0x1ba461);
  return in_RDI;
}

Assistant:

string CodeGen::generateType(const NodePtr& n)
{
    NodePtr nn = (n->type() == avro::AVRO_SYMBOLIC) ?  resolveSymbol(n) : n;

    map<NodePtr, string>::const_iterator it = done.find(nn);
    if (it != done.end()) {
        return it->second;
    }
    string result = doGenerateType(nn);
    done[nn] = result;
    return result;
}